

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  long *plVar6;
  int i;
  int iVar7;
  allocator_type local_2bb;
  char InputByte;
  allocator_type local_2b9;
  ulong local_2b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> TmpArr1;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  state_alt;
  vector<unsigned_long,_std::allocator<unsigned_long>_> TmpArr2;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  state_main;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_250;
  ifstream InputDatei;
  
  if (1 < argc) {
    iVar3 = atoi(argv[1]);
    local_2b8 = CONCAT44(extraout_var,iVar3);
    BitRate = iVar3 * -2 + 0x640;
    uVar1 = iVar3 - 0xe0U >> 5;
    if (((iVar3 << 0x1b | uVar1) < 10) && ((0x223U >> (uVar1 & 0x1f) & 1) != 0)) {
      std::ifstream::ifstream(&InputDatei,argv[2],_S_in|_S_bin);
      TmpArr1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&state_alt,5,
                 (value_type *)&TmpArr1,(allocator_type *)&TmpArr2);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector(&state_main,5,(value_type *)&state_alt,&local_2bb);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&state_alt);
      TmpArr2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&TmpArr1,5,(value_type *)&TmpArr2,(allocator_type *)&local_2bb);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector(&state_alt,5,&TmpArr1,&local_2b9);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&TmpArr1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&TmpArr1,5,(allocator_type *)&TmpArr2);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&TmpArr2,5,(allocator_type *)&local_2bb);
      bVar2 = false;
      while (!bVar2) {
        iVar3 = 0;
        while ((iVar3 < BitRate / 8 && (!bVar2))) {
          plVar6 = (long *)std::istream::get((char *)&InputDatei);
          if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0) {
            Absorb(InputByte,&state_main,iVar3);
          }
          else {
            bVar2 = true;
            pad(&state_main,iVar3);
          }
          iVar3 = iVar3 + 1;
        }
        RPerm(&state_main,&state_alt,&TmpArr1,&TmpArr2);
      }
      std::ifstream::close();
      local_2b8 = local_2b8 >> 5 & 0x7ffffff;
      for (iVar3 = 0; iVar3 != (int)local_2b8; iVar3 = iVar3 + 1) {
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::vector(&local_250,&state_main);
        uVar4 = Squeeze(&local_250,iVar3);
        std::
        vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
        ::~vector(&local_250);
        for (iVar7 = 0; iVar7 != 0x20; iVar7 = iVar7 + 8) {
          *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) =
               *(uint *)(std::ios_base::Init::Init + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
          poVar5 = std::operator<<(&std::cout,0x30);
          *(undefined8 *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = 2;
          std::ostream::operator<<(poVar5,uVar4 >> ((byte)iVar7 & 0x1f) & 0xff);
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&TmpArr2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&TmpArr1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(&state_alt);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(&state_main);
      std::ifstream::~ifstream(&InputDatei);
      return 0;
    }
  }
  poVar5 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_75e9);
  std::endl<char,std::char_traits<char>>(poVar5);
  return 0;
}

Assistant:

int main(int argc, char *argv[]){
    if(argc < 2){
        cout << "Verwendung: ./Keccak [Output-Länge] [Datei]\nDer Output muss entweder 224, 256, 384 oder 512 Bits lang sein" << endl;
        return 0;
    }

    //Output-Länge&Bitrate
    int Hashlength = atoi(argv[1]);
    BitRate = 1600 - (2*Hashlength);

    if(Hashlength != 512 && Hashlength != 384 && Hashlength != 256 && Hashlength != 224){
        cout << "Verwendung: ./Keccak [Output-Länge] [Datei]\nDer Output muss entweder 224, 256, 384 oder 512 Bits lang sein" << endl;
        return 0;
    }

    ifstream InputDatei (argv[2], fstream::in|fstream::binary);
    char InputByte;

    //Arrays für die Permutationsfunktion
    vector< vector<uint64_t> > state_main (5, vector<uint64_t> (5, 0)); //State Array
    vector< vector<uint64_t> > state_alt (5, vector<uint64_t> (5, 0)); //Für Zwischenresultate in RPerm
    vector<uint64_t> TmpArr1 (5), TmpArr2 (5); //Für Zwischenresultate in Theta

    //Sponge-Konstruktion: Aufnahme & Verarbeitung der Daten
    bool DateiZuEnde = false;
    while(!DateiZuEnde){
        for(int i = 0; i < BitRate/8 && !DateiZuEnde; i++){
            if(InputDatei.get(InputByte)){
                Absorb(InputByte, state_main, i); //Nimmt das nächste Byte der Datei in das Zustandsarray auf
            }else{
                DateiZuEnde = true;
                pad(state_main, i);
            }
        }
        RPerm(state_main, state_alt, TmpArr1, TmpArr2);
    }
    InputDatei.close();

    //Hash-Output
    for(int t=0; t < Hashlength/32; t++){
        uint32_t Hash = Squeeze(state_main, t); //224/64 = 3.5 -> uint32_t statt uint64_t
        for(int b = 0; b < 4; b++){
            int by = (Hash >> 8*b) & 255;
            cout << hex << setfill('0') << setw(2) << by;
        }
    }
    cout << endl;

    return 0;
}